

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O3

void __thiscall
Rml::ElementFormControlTextArea::OnPropertyChange
          (ElementFormControlTextArea *this,PropertyIdSet *changed_properties)

{
  PropertyIdSet *pPVar1;
  PropertyIdSet *pPVar2;
  ulong uVar3;
  
  Element::OnPropertyChange((Element *)this,changed_properties);
  pPVar1 = StyleSheetSpecification::GetRegisteredInheritedProperties();
  pPVar2 = StyleSheetSpecification::GetRegisteredPropertiesForcingLayout();
  uVar3 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0];
  if (((pPVar2->defined_ids).super__Base_bitset<2UL>._M_w[1] &
       (pPVar1->defined_ids).super__Base_bitset<2UL>._M_w[1] &
      (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[1]) != 0 ||
      ((pPVar2->defined_ids).super__Base_bitset<2UL>._M_w[0] &
       (pPVar1->defined_ids).super__Base_bitset<2UL>._M_w[0] & uVar3) != 0) {
    WidgetTextInput::ForceFormattingOnNextLayout
              (&((this->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
                super_WidgetTextInput);
    uVar3 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0];
  }
  if ((uVar3 & 0x180000000000) != 0) {
    WidgetTextInput::UpdateSelectionColours
              (&((this->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
                super_WidgetTextInput);
    uVar3 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0];
  }
  if ((uVar3 >> 0x2d & 1) == 0) {
    return;
  }
  WidgetTextInput::GenerateCursor
            (&((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput);
  return;
}

Assistant:

void ElementFormControlTextArea::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	ElementFormControl::OnPropertyChange(changed_properties);

	// Some inherited properties require text formatting update, mainly font and line-height properties.
	const PropertyIdSet changed_inherited_layout_properties = changed_properties &
		(StyleSheetSpecification::GetRegisteredInheritedProperties() & StyleSheetSpecification::GetRegisteredPropertiesForcingLayout());

	if (!changed_inherited_layout_properties.Empty())
		widget->ForceFormattingOnNextLayout();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::BackgroundColor))
		widget->UpdateSelectionColours();

	if (changed_properties.Contains(PropertyId::CaretColor))
		widget->GenerateCursor();
}